

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageErrorsTest::Clean(StorageErrorsTest *this)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  StorageErrorsTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  if (this->m_rbo_valid != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x460))(1,&this->m_rbo_valid);
    this->m_rbo_valid = 0;
  }
  this->m_internalformat_invalid = 0x8225;
  this->m_rbo_valid = 0;
  this->m_rbo_invalid = 0;
  do {
    iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void StorageErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release GL objects. */
	if (m_rbo_valid)
	{
		gl.deleteRenderbuffers(1, &m_rbo_valid);
		m_rbo_valid = 0;
	}

	/*  COmpressed internal formats are not color renderable (OpenGL 4.5 Core PRofile SPecification Chapter 9.4 )*/
	m_internalformat_invalid = GL_COMPRESSED_RED;

	/* Set initial values - all test shall have the same environment. */
	m_rbo_valid   = 0;
	m_rbo_invalid = 0;

	/* Errors clean up. */
	while (gl.getError())
		;
}